

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O1

void __thiscall SCCTest_SingletonLoop_Test::TestBody(SCCTest_SingletonLoop_Test *this)

{
  Iterator *pIVar1;
  ulong uVar2;
  ulong uVar3;
  AssertionResult *this_00;
  char *pcVar4;
  initializer_list<unsigned_int> __l;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_00;
  undefined4 local_188;
  int iStack_184;
  GraphSCCs sccs;
  undefined1 local_f8 [8];
  Graph_conflict1 graph;
  Iterator sccIt;
  AssertionResult gtest_ar_6;
  SCC local_90;
  Iterator it;
  less<unsigned_int> local_4c;
  allocator_type local_4b;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_4a;
  allocator_type local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
            *)local_f8,1,(allocator_type *)&local_188);
  Graph::addEdge((Graph *)local_f8,0,0);
  iStack_184 = (int)((ulong)((long)graph.graph.
                                   super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)local_f8) >> 4)
               * -0x55555555;
  sccs.super_SCCs<IntIt,_GraphSCCs>.stack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)&sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_rehash_policy._M_next_resize;
  local_188 = 0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.inputIt.i = 0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.inputEnd.i = 0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.workStack.
  super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.workStack.
  super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.workStack.
  super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.stack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.stack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_buckets = (__buckets_ptr)0x1;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_bucket_count = 0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0
  ;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_element_count._0_4_ = 0x3f800000;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_rehash_policy._4_4_ = 0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_rehash_policy._M_next_resize = 0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.elementInfo._M_h._M_single_bucket._4_1_ = 0;
  sccs.super_SCCs<IntIt,_GraphSCCs>.currParent.super__Optional_base<unsigned_int,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = false;
  sccs.super_SCCs<IntIt,_GraphSCCs>.currRoot.super__Optional_base<unsigned_int,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)local_f8;
  local_48 = (undefined1  [8])&local_188;
  pIVar1 = ::wasm::SCCs<IntIt,_GraphSCCs>::Iterator::operator++((Iterator *)local_48);
  local_90.parent = (pIVar1->scc).parent;
  it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
  testing::internal::
  CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
            ((internal *)local_48,"it","sccs.end()",(Iterator *)&local_90,&it);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&it);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
LAB_001c0194:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
      (**(code **)(*(long *)it.scc.parent + 8))();
    }
    if (gtest_ar._0_8_ == 0) goto LAB_001c01c1;
    this_00 = &gtest_ar;
    gtest_ar_6._0_8_ = gtest_ar._0_8_;
  }
  else {
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    if ((local_90.parent == (SCCs<IntIt,_GraphSCCs> *)0x0) ||
       (((local_90.parent)->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged != true)) {
      uVar3 = 0;
      uVar2 = 0;
    }
    else {
      uVar3 = 0x100000000;
      uVar2 = (ulong)((local_90.parent)->stack).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1];
    }
    sccIt.parent = (SCCs<IntIt,_GraphSCCs> *)(uVar3 | uVar2);
    graph.graph.
    super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_90.parent;
    it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
    testing::internal::
    CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator,wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator>
              ((internal *)local_48,"sccIt","scc.end()",
               (Iterator *)
               &graph.graph.
                super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Iterator *)&it);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&it);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x82,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
      goto LAB_001c0194;
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    it.scc.parent._0_4_ = (uint)sccIt.parent;
    gtest_ar_6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)local_48,"*sccIt","0u",(uint *)&it,(uint *)&gtest_ar_6.message_);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&it);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x83,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
        (**(code **)(*(long *)it.scc.parent + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    ::wasm::SCCs<IntIt,_GraphSCCs>::stepToNextElem
              ((SCCs<IntIt,_GraphSCCs> *)
               graph.graph.
               super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((graph.graph.
         super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) ||
       (*(char *)((long)&graph.graph.
                         super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[2]._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left + 4) == '\0')) {
      if (sccIt.parent._4_1_ == '\x01') {
        sccIt.parent._0_5_ = CONCAT14(0,(uint)sccIt.parent);
      }
    }
    else {
      sccIt.parent = (SCCs<IntIt,_GraphSCCs> *)
                     ((ulong)*(uint *)(((graph.graph.
                                         super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                       _M_impl.super__Rb_tree_header._M_node_count - 4) |
                     0x100000000);
    }
    it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
    testing::internal::
    CmpHelperEQ<wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator,wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator>
              ((internal *)local_48,"sccIt","scc.end()",
               (Iterator *)
               &graph.graph.
                super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Iterator *)&it);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&it);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x86,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
        (**(code **)(*(long *)it.scc.parent + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
    testing::internal::
    CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
              ((internal *)local_48,"it","sccs.end()",(Iterator *)&local_90,&it);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&it);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x87,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
      goto LAB_001c0194;
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    ::wasm::SCCs<IntIt,_GraphSCCs>::Iterator::operator++((Iterator *)&local_90);
    it.scc.parent = (SCC)(SCCs<IntIt,_GraphSCCs> *)0x0;
    testing::internal::
    CmpHelperEQ<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
              ((internal *)local_48,"it","sccs.end()",(Iterator *)&local_90,&it);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&it);
      if (gtest_ar._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x8a,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_6.message_,(Message *)&it);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      if (it.scc.parent != (SCCs<IntIt,_GraphSCCs> *)0x0) {
        (**(code **)(*(long *)it.scc.parent + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    getSCCs((SCCSet *)local_48,(Graph_conflict1 *)local_f8);
    sccs.graph._4_4_ = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)((long)&sccs.graph + 4);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &gtest_ar_6.message_,__l,&local_4c,&local_4b);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&gtest_ar_6.message_;
    std::
    set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ::set((set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           *)&it,__l_00,&local_4a,&local_49);
    testing::internal::
    CmpHelperEQ<std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
              ((internal *)&sccIt.val,"getSCCs(graph)","SCCSet{{0}}",
               (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                *)local_48,
               (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                *)&it);
    std::
    _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 *)&it);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&gtest_ar_6.message_);
    std::
    _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 *)local_48);
    if (sccIt.val.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ == '\0') {
      testing::Message::Message((Message *)local_48);
      if (gtest_ar_6._0_8_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_6._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&it,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x8c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&it,(Message *)local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it);
      if (local_48 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_48 + 8))();
      }
    }
    if (gtest_ar_6._0_8_ == 0) goto LAB_001c01c1;
    this_00 = &gtest_ar_6;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar_6._0_8_);
LAB_001c01c1:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sccs.super_SCCs<IntIt,_GraphSCCs>.stack.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (sccs.super_SCCs<IntIt,_GraphSCCs>.workStack.
      super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(sccs.super_SCCs<IntIt,_GraphSCCs>.workStack.
                    super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)sccs.super_SCCs<IntIt,_GraphSCCs>.stack.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)sccs.super_SCCs<IntIt,_GraphSCCs>.workStack.
                          super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (sccs.super_SCCs<IntIt,_GraphSCCs>._0_8_ != 0) {
    operator_delete((void *)sccs.super_SCCs<IntIt,_GraphSCCs>._0_8_,
                    (long)sccs.super_SCCs<IntIt,_GraphSCCs>.workStack.
                          super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    sccs.super_SCCs<IntIt,_GraphSCCs>._0_8_);
  }
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_f8);
  return;
}

Assistant:

TEST(SCCTest, SingletonLoop) {
  // Same as above, but now there is an edge. The results are the same.
  Graph graph(1);
  graph.addEdge(0, 0);
  GraphSCCs sccs(graph);

  auto it = sccs.begin();
  ASSERT_NE(it, sccs.end());

  auto scc = *it;
  auto sccIt = scc.begin();
  ASSERT_NE(sccIt, scc.end());
  EXPECT_EQ(*sccIt, 0u);

  ++sccIt;
  EXPECT_EQ(sccIt, scc.end());
  ASSERT_NE(it, sccs.end());

  ++it;
  EXPECT_EQ(it, sccs.end());

  EXPECT_EQ(getSCCs(graph), SCCSet{{0}});
}